

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

string * positionDeque2String_abi_cxx11_
                   (string *__return_storage_ptr__,dequePositionTy *_l,positionTy *posAfterLast)

{
  positionTy *ppVar1;
  positionTy *ppVar2;
  double dVar3;
  char cVar4;
  pointer pcVar5;
  positionTy *ppVar6;
  _Elt_pointer this;
  vectorTy v;
  dequePositionTy l;
  undefined1 local_d8 [32];
  _Map_pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  positionTy *local_a8;
  vectorTy local_a0;
  _Deque_base<positionTy,_std::allocator<positionTy>_> local_80;
  
  local_b0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a8 = posAfterLast;
  if ((_l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (_l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x246a95);
  }
  else {
    std::deque<positionTy,_std::allocator<positionTy>_>::deque
              ((deque<positionTy,_std::allocator<positionTy>_> *)&local_80,_l);
    if (local_80._M_impl.super__Deque_impl_data._M_start._M_cur !=
        local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      local_b8 = local_80._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVar6 = local_80._M_impl.super__Deque_impl_data._M_start._M_last;
      this = local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      do {
        positionTy::dbgTxt_abi_cxx11_((string *)local_d8,this);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_d8._0_8_);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        ppVar2 = this + 1;
        ppVar1 = ppVar2;
        if (ppVar2 == ppVar6) {
          ppVar1 = local_b8[1];
        }
        cVar4 = (char)__return_storage_ptr__;
        if (ppVar1 == local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          if ((local_a8 != (positionTy *)0x0) &&
             (CoordVectorBetween((vectorTy *)local_d8,this,local_a8), 1e-05 < (double)local_d8._8_8_
             )) {
            std::__cxx11::string::push_back(cVar4);
            vectorTy::operator_cast_to_string((string *)&local_a0,(vectorTy *)local_d8);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0.angle);
            dVar3 = local_a0.vsi;
            pcVar5 = (pointer)local_a0.angle;
            if ((double *)local_a0.angle != &local_a0.vsi) goto LAB_00128f58;
          }
        }
        else {
          std::__cxx11::string::push_back(cVar4);
          ppVar1 = ppVar2;
          if (ppVar2 == ppVar6) {
            ppVar1 = local_b8[1];
          }
          CoordVectorBetween(&local_a0,this,ppVar1);
          vectorTy::operator_cast_to_string((string *)local_d8,&local_a0);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_d8._0_8_);
          dVar3 = (double)local_d8._16_8_;
          pcVar5 = (pointer)local_d8._0_8_;
          if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
LAB_00128f58:
            operator_delete(pcVar5,(long)dVar3 + 1);
          }
        }
        std::__cxx11::string::push_back(cVar4);
        if (ppVar2 == ppVar6) {
          ppVar2 = local_b8[1];
          local_b8 = local_b8 + 1;
          ppVar6 = ppVar2 + 7;
        }
        this = ppVar2;
      } while (ppVar2 != local_80._M_impl.super__Deque_impl_data._M_finish._M_cur);
    }
    std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string positionDeque2String (const dequePositionTy& _l,
                                  const positionTy* posAfterLast)
{
    std::string ret;
    
    if (_l.empty())
        ret = "<empty>\n";
    else {
        // copy for better thread safety
        const dequePositionTy l(_l);
        for (dequePositionTy::const_iterator iter = l.cbegin();
            iter != l.cend();
            ++iter)
        {
            ret += iter->dbgTxt();              // add position info
            if (std::next(iter) != l.cend())    // there is a next position
            {
                ret += ' ';                     // add vector to next position
                ret += iter->between(*std::next(iter));
            } else if (posAfterLast) {          // a pos after last is given for final vector?
                const vectorTy v = iter->between(*posAfterLast);
                if (v.dist > 0.00001) {         // and that pos is not about the same as current
                    ret += ' ';                 // add vector to that position
                    ret += v;
                }
            }
            ret += '\n';
        }
    }
    return ret;
}